

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_utf.h
# Opt level: O0

wstring * booster::locale::conv::utf_to_utf<wchar_t,wchar_t>
                    (wchar_t *begin,wchar_t *end,method_type how)

{
  code_point cVar1;
  undefined8 uVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  wstring *in_RDI;
  code_point c;
  inserter_type inserter;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_ffffffffffffff90;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_ffffffffffffff98;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_38;
  conversion_error *in_stack_ffffffffffffffd0;
  
  std::__cxx11::wstring::wstring(in_RDI);
  std::__cxx11::wstring::reserve((ulong)in_RDI);
  std::
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::back_insert_iterator
            (&local_38,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)in_RDI);
  do {
    while( true ) {
      if (in_RSI == in_RDX) {
        return in_RDI;
      }
      cVar1 = utf::utf_traits<wchar_t,4>::decode<wchar_t_const*>
                        ((wchar_t **)in_stack_ffffffffffffff98.container,
                         (wchar_t *)in_stack_ffffffffffffff90.container);
      if ((cVar1 == 0xffffffff) || (cVar1 == 0xfffffffe)) break;
      in_stack_ffffffffffffff90 =
           utf::utf_traits<wchar_t,4>::encode<std::back_insert_iterator<std::__cxx11::wstring>>
                     ((code_point)((ulong)in_stack_ffffffffffffff90.container >> 0x20),
                      in_stack_ffffffffffffff98);
    }
  } while (in_ECX != 1);
  uVar2 = __cxa_allocate_exception(0x30);
  conversion_error::conversion_error(in_stack_ffffffffffffffd0);
  __cxa_throw(uVar2,&conversion_error::typeinfo,conversion_error::~conversion_error);
}

Assistant:

std::basic_string<CharOut>
            utf_to_utf(CharIn const *begin,CharIn const *end,method_type how = default_method)
            {
                std::basic_string<CharOut> result;
                result.reserve(end-begin);
                typedef std::back_insert_iterator<std::basic_string<CharOut> > inserter_type;
                inserter_type inserter(result);
                utf::code_point c;
                while(begin!=end) {
                    c=utf::utf_traits<CharIn>::template decode<CharIn const *>(begin,end);
                    if(c==utf::illegal || c==utf::incomplete) {
                        if(how==stop)
                            throw conversion_error();
                    }
                    else {
                        utf::utf_traits<CharOut>::template encode<inserter_type>(c,inserter);
                    }
                }
                return result;
            }